

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O1

int chacha_check_validity(void)

{
  uint uVar1;
  uint uVar2;
  uint8_t zero_buffer [2049];
  uint8_t auStack_818 [2064];
  
  memset(auStack_818,0,0x801);
  uVar1 = chacha_test(auStack_818);
  uVar2 = chacha_test((uint8_t *)0x0);
  return uVar2 & uVar1;
}

Assistant:

int
chacha_check_validity() {
    /* unaligned generation is tested, so buffer must have max+1 bytes */
    uint8_t zero_buffer[CHACHA_TEST_LEN+1] = {0};
    int res = 1;
    res &= chacha_test(zero_buffer); /* xors stream of random bytes with zero_buffer */
    res &= chacha_test(NULL); /* writes stream of random bytes directly */
    return res;
}